

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O0

char * __thiscall TadsHttpRequestHeader::find(TadsHttpRequestHeader *this,char *name)

{
  int iVar1;
  char *in_RDI;
  TadsHttpRequestHeader *h;
  char *in_stack_ffffffffffffffd8;
  
  while( true ) {
    if (in_RDI == (char *)0x0) {
      return (char *)0x0;
    }
    iVar1 = stricmp(in_RDI,in_stack_ffffffffffffffd8);
    if (iVar1 == 0) break;
    in_RDI = *(char **)(in_RDI + 0x10);
  }
  return *(char **)(in_RDI + 8);
}

Assistant:

const char *find(const char *name)
    {
        /* scan the list, starting with this element */
        for (TadsHttpRequestHeader *h = this ; h != 0 ; h = h->nxt)
        {
            /* if this name matches, return the value */
            if (stricmp(h->name, name) == 0)
                return h->value;
        }
        
        /* didn't find a match */
        return 0;
    }